

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.h
# Opt level: O2

base_uint<256UL,_void> * __thiscall
jbcoin::SerialIter::getBitString<256,void>
          (base_uint<256UL,_void> *__return_storage_ptr__,SerialIter *this)

{
  ulong uVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  
  uVar1 = this->remain_;
  if (0x1f < uVar1) {
    puVar2 = this->p_;
    uVar3 = *(undefined8 *)puVar2;
    uVar4 = *(undefined8 *)(puVar2 + 8);
    uVar5 = *(undefined8 *)(puVar2 + 0x18);
    *(undefined8 *)(__return_storage_ptr__->pn + 4) = *(undefined8 *)(puVar2 + 0x10);
    *(undefined8 *)(__return_storage_ptr__->pn + 6) = uVar5;
    *(undefined8 *)__return_storage_ptr__->pn = uVar3;
    *(undefined8 *)(__return_storage_ptr__->pn + 2) = uVar4;
    this->p_ = puVar2 + 0x20;
    this->used_ = this->used_ + 0x20;
    this->remain_ = uVar1 - 0x20;
    return __return_storage_ptr__;
  }
  Throw<std::runtime_error,char_const(&)[32]>((char (*) [32])"invalid SerialIter getBitString");
}

Assistant:

base_uint<Bits, Tag>
SerialIter::getBitString()
{
    base_uint<Bits, Tag> u;
    auto const n = Bits/8;
    if (remain_ < n)
        Throw<std::runtime_error> (
            "invalid SerialIter getBitString");
    std::memcpy (u.begin(), p_, n);
    p_ += n;
    used_ += n;
    remain_ -= n;
    return u;
}